

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml_print.hpp
# Opt level: O1

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 rapidxml::internal::print_attributes<std::back_insert_iterator<std::__cxx11::string>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,xml_node<char> *node,int flags)

{
  xml_node<char> *pxVar1;
  xml_node<char> *pxVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  char cVar6;
  char *pcVar7;
  char noexpand;
  
  pxVar1 = (xml_node<char> *)node->m_first_attribute;
  do {
    pxVar2 = pxVar1;
    if (pxVar2 == (xml_node<char> *)0x0) {
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    }
    cVar6 = (char)out.container;
    std::__cxx11::string::push_back(cVar6);
    if ((pxVar2->super_xml_base<char>).m_name == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = (pxVar2->super_xml_base<char>).m_name_size;
    }
    if (sVar3 != 0) {
      sVar4 = 0;
      do {
        std::__cxx11::string::push_back(cVar6);
        sVar4 = sVar4 + 1;
      } while (sVar3 != sVar4);
    }
    std::__cxx11::string::push_back(cVar6);
    pcVar7 = (pxVar2->super_xml_base<char>).m_value;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = &xml_base<char>::nullstr()::zero;
      sVar3 = 0;
    }
    else {
      sVar3 = (pxVar2->super_xml_base<char>).m_value_size;
    }
    sVar4 = 0;
    do {
      sVar5 = sVar4;
      if (sVar3 == sVar5) goto LAB_00115c3c;
      sVar4 = sVar5 + 1;
    } while (pcVar7[sVar5] != '\"');
    if (sVar3 == sVar5) {
LAB_00115c3c:
      noexpand = '\'';
    }
    else {
      noexpand = '\"';
    }
    std::__cxx11::string::push_back(cVar6);
    pcVar7 = (pxVar2->super_xml_base<char>).m_value;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = &xml_base<char>::nullstr()::zero;
      sVar3 = 0;
    }
    else {
      sVar3 = (pxVar2->super_xml_base<char>).m_value_size;
    }
    out = copy_and_expand_chars<std::back_insert_iterator<std::__cxx11::string>,char>
                    (pcVar7,pcVar7 + sVar3,noexpand,out);
    std::__cxx11::string::push_back((char)out.container);
    pxVar1 = (pxVar2->super_xml_base<char>).m_parent;
    if (pxVar1 != (xml_node<char> *)0x0) {
      pxVar1 = pxVar2->m_first_node;
    }
  } while( true );
}

Assistant:

inline OutIt print_attributes(OutIt out, const xml_node<Ch> *node, int flags)
        {
            for (xml_attribute<Ch> *attribute = node->first_attribute(); attribute; attribute = attribute->next_attribute())
            {
                if (attribute->name() && attribute->value())
                {
                    // Print attribute name
                    *out = Ch(' '), ++out;
                    out = copy_chars(attribute->name(), attribute->name() + attribute->name_size(), out);
                    *out = Ch('='), ++out;
                    // Print attribute value using appropriate quote type
                    if (find_char<Ch, Ch('"')>(attribute->value(), attribute->value() + attribute->value_size()))
                    {
                        *out = Ch('\''), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('"'), out);
                        *out = Ch('\''), ++out;
                    }
                    else
                    {
                        *out = Ch('"'), ++out;
                        out = copy_and_expand_chars(attribute->value(), attribute->value() + attribute->value_size(), Ch('\''), out);
                        *out = Ch('"'), ++out;
                    }
                }
            }
            return out;
        }